

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_encoding.cpp
# Opt level: O2

string * __thiscall
bidfx_public_api::price::pixie::FieldEncodingMethods::ToString_abi_cxx11_
          (string *__return_storage_ptr__,FieldEncodingMethods *this,
          FieldEncodingEnum field_encoding)

{
  uint uVar1;
  invalid_argument *this_00;
  undefined7 in_register_00000011;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  uVar1 = (uint)this;
  switch(uVar1) {
  case 0x30:
    __s = "NOOP";
    break;
  case 0x31:
    __s = "FIXED1";
    break;
  case 0x32:
    __s = "FIXED2";
    break;
  case 0x33:
    __s = "FIXED3";
    break;
  case 0x34:
    __s = "FIXED4";
    break;
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x41:
switchD_001a4bee_caseD_35:
    this_00 = (invalid_argument *)
              __cxa_allocate_exception(0x10,this,CONCAT71(in_register_00000011,field_encoding));
    std::__cxx11::to_string(&local_98,uVar1 & 0xff);
    std::operator+(&local_78,"unrecognised field encoding code: ",&local_98);
    std::operator+(&local_58,&local_78," (\'");
    std::operator+(&local_38,&local_58,(char)this);
    std::operator+(&bStack_b8,&local_38,"\').");
    std::invalid_argument::invalid_argument(this_00,(string *)&bStack_b8);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  case 0x38:
    __s = "FIXED8";
    break;
  case 0x40:
    __s = "FIXED16";
    break;
  case 0x42:
    __s = "BYTE_ARRAY";
    break;
  default:
    if (uVar1 == 0) {
      __s = "NOT_DEFINED";
    }
    else if (uVar1 == 0x53) {
      __s = "VARINT_STRING";
    }
    else if (uVar1 == 0x56) {
      __s = "VARINT";
    }
    else {
      if (uVar1 != 0x5a) goto switchD_001a4bee_caseD_35;
      __s = "ZIGZAG";
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&bStack_b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldEncodingMethods::ToString(FieldEncodingEnum field_encoding)
{
    switch (field_encoding)
    {
        case FieldEncodingEnum::NOOP:
            return "NOOP";
        case FieldEncodingEnum::FIXED1:
            return "FIXED1";
        case FieldEncodingEnum::FIXED2:
            return "FIXED2";
        case FieldEncodingEnum::FIXED3:
            return "FIXED3";
        case FieldEncodingEnum::FIXED4:
            return "FIXED4";
        case FieldEncodingEnum::FIXED8:
            return "FIXED8";
        case FieldEncodingEnum::FIXED16:
            return "FIXED16";
        case FieldEncodingEnum::BYTE_ARRAY:
            return "BYTE_ARRAY";
        case FieldEncodingEnum::VARINT:
            return "VARINT";
        case FieldEncodingEnum::VARINT_STRING:
            return "VARINT_STRING";
        case FieldEncodingEnum::ZIGZAG:
            return "ZIGZAG";
        case FieldEncodingEnum::NOT_DEFINED:
            return "NOT_DEFINED";
        default:
            throw std::invalid_argument("unrecognised field encoding code: " +
                                        std::to_string(field_encoding) + " ('" + (char) field_encoding + "').");
    }
}